

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O1

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_short>::clear(ImageTemplate<unsigned_short> *this)

{
  unsigned_short *puVar1;
  FunctionFacade *this_00;
  _func_void_unsigned_short_ptr *p_Var2;
  
  puVar1 = this->_data;
  if (puVar1 != (unsigned_short *)0x0) {
    this_00 = FunctionFacade::instance();
    p_Var2 = __PenguinV_Image__ImageTemplate<unsigned_short>__FunctionFacade___getFunction<void(*)(unsigned_short*)>_std__vector<void(*)(unsigned_short*),std::allocator<void(*)(unsigned_short*)>>const__unsigned_char_const_
                       (this_00,&this_00->_deallocate,this->_type);
    (*p_Var2)(puVar1);
    this->_data = (unsigned_short *)0x0;
  }
  this->_width = 0;
  this->_height = 0;
  this->_rowSize = 0;
  return;
}

Assistant:

void clear()
        {
            if( _data != nullptr ) {
                _deallocate( _data );
                _data = nullptr;
            }

            _width   = 0;
            _height  = 0;
            _rowSize = 0;
        }